

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

_Bool upb_Map_Delete(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  char cVar1;
  double dVar2;
  char ****key_00;
  _Bool _Var3;
  upb_StringView *strp;
  size_t len;
  upb_value v;
  uintptr_t intkey;
  upb_value local_40;
  double *local_38;
  char ***local_30;
  size_t local_28;
  
  local_28 = key.str_val.size;
  local_30 = (char ***)key.str_val.data;
  if (map->is_frozen_dont_copy_me__upb_internal_use_only != true) {
    cVar1 = map->key_size;
    if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
      len = local_28;
      key_00 = (char ****)local_30;
      if (cVar1 != '\0') {
        len = (long)cVar1;
        key_00 = &local_30;
      }
      _Var3 = upb_strtable_remove2(&(map->t).strtable,(char *)key_00,len,&local_40);
    }
    else {
      local_38 = (double *)0x0;
      memcpy(&local_38,&local_30,(long)cVar1);
      _Var3 = upb_inttable_remove(&(map->t).inttable,(uintptr_t)local_38,&local_40);
    }
    if (val != (upb_MessageValue *)0x0) {
      local_38 = (double *)local_40.val;
      if ((long)map->val_size == 0) {
        dVar2 = *(double *)(local_40.val + 8);
        val->double_val = *(double *)local_40.val;
        (val->str_val).size = (size_t)dVar2;
      }
      else {
        memcpy(val,&local_38,(long)map->val_size);
      }
    }
    return _Var3;
  }
  __assert_fail("!upb_Map_IsFrozen(map)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/map.h"
                ,0x90,"_Bool _upb_Map_Delete(struct upb_Map *, const void *, size_t, upb_value *)");
}

Assistant:

bool upb_Map_Delete(upb_Map* map, upb_MessageValue key, upb_MessageValue* val) {
  upb_value v;
  const bool removed = _upb_Map_Delete(map, &key, map->key_size, &v);
  if (val) _upb_map_fromvalue(v, val, map->val_size);
  return removed;
}